

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bad_alloc *anon_var_0;
  string local_78 [55];
  allocator local_41;
  string local_40 [35];
  byte local_1d;
  int local_1c;
  bool skipheader;
  char **ppcStack_18;
  int opt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  progname = *argv;
  local_1d = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    local_1c = getopt((int)argv_local,ppcStack_18,"svh");
    if (local_1c == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"",&local_41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"",(allocator *)((long)&anon_var_0 + 7));
      initstreams((string *)local_40,(string *)local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      evetocsv::doit((bool)(local_1d & 1));
      return 0;
    }
    if (local_1c == 0x68) break;
    if (local_1c != 0x73) {
      if (local_1c == 0x76) {
        fprintf(_stderr,"%s : version: %s\n",*ppcStack_18,"");
        exit(1);
      }
      break;
    }
    local_1d = 1;
    local_1c = 0x73;
  }
  help();
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "svh")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	initstreams();
	try {
		evetocsv::doit(skipheader);
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	return EXIT_SUCCESS;
}